

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (puVar2 == (undefined8 *)0x0) {
    SharedDtor(this);
    if ((this_00->ptr_ & 1) != 0) {
      internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    }
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField(&this->reserved_name_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::~RepeatedPtrField
            (&this->reserved_range_);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::~RepeatedPtrField(&this->oneof_decl_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->extension_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::~RepeatedPtrField
            (&this->extension_range_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField(&this->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField(&this->nested_type_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->field_);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MessageLite_004e16b0;
  internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.DescriptorProto)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}